

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFontGlyphRangesBuilder::AddRanges(ImFontGlyphRangesBuilder *this,ImWchar *ranges)

{
  uint *puVar1;
  ushort uVar2;
  long lVar3;
  ushort uVar4;
  
  uVar4 = *ranges;
  do {
    if (uVar4 == 0) {
      return;
    }
    uVar2 = ranges[1];
    if (uVar4 <= uVar2) {
      lVar3 = *(long *)(this + 8);
      do {
        if (*(int *)this <= (int)(uint)(uVar4 >> 5)) {
          __assert_fail("i < Size",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                        ,0x52e,"T &ImVector<unsigned int>::operator[](int) [T = unsigned int]");
        }
        puVar1 = (uint *)(lVar3 + (ulong)(uint)(uVar4 >> 5) * 4);
        *puVar1 = *puVar1 | 1 << ((byte)uVar4 & 0x1f);
        uVar4 = uVar4 + 1;
      } while (uVar4 <= uVar2);
    }
    uVar4 = ranges[2];
    ranges = ranges + 2;
  } while( true );
}

Assistant:

void ImFontGlyphRangesBuilder::AddRanges(const ImWchar* ranges)
{
    for (; ranges[0]; ranges += 2)
        for (ImWchar c = ranges[0]; c <= ranges[1]; c++)
            AddChar(c);
}